

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  size_t in_R8;
  string_view message;
  memory_buffer outbuf;
  long *local_268 [2];
  long local_258 [2];
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  ulong local_230;
  undefined1 local_228 [504];
  
  *(undefined ***)this = &PTR__spdlog_ex_00125d88;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_238 = 0;
  local_248 = &PTR_grow_00124ff0;
  local_230 = 500;
  message.size_ = in_R8;
  message.data_ = (char *)msg->_M_string_length;
  local_240 = local_228;
  fmt::v5::format_system_error
            ((v5 *)&local_248,(buffer *)(ulong)(uint)last_errno,(int)(msg->_M_dataplus)._M_p,message
            );
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,local_240,local_240 + local_238);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)local_268);
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  local_248 = &PTR_grow_00124ff0;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  return;
}

Assistant:

spdlog_ex(const std::string &msg, int last_errno)
    {
        fmt::memory_buffer outbuf;
        fmt::format_system_error(outbuf, last_errno, msg);
        msg_ = fmt::to_string(outbuf);
    }